

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isac.c
# Opt level: O3

int16_t EncoderInitLb(ISACLBStruct *instLB,int16_t codingMode,IsacSamplingRate sampRate)

{
  int16_t iVar1;
  
  memset(instLB,0,400);
  iVar1 = 0x3c0;
  if (sampRate == kIsacSuperWideband) {
    iVar1 = 0x1e0;
  }
  if (codingMode == 1) {
    iVar1 = 0x1e0;
  }
  (instLB->ISACencLB_obj).new_framelength = iVar1;
  WebRtcIsac_InitMasking(&(instLB->ISACencLB_obj).maskfiltstr_obj);
  WebRtcIsac_InitPreFilterbank(&(instLB->ISACencLB_obj).prefiltbankstr_obj);
  WebRtcIsac_InitPitchFilter(&(instLB->ISACencLB_obj).pitchfiltstr_obj);
  WebRtcIsac_InitPitchAnalysis(&(instLB->ISACencLB_obj).pitchanalysisstr_obj);
  (instLB->ISACencLB_obj).buffer_index = 0;
  (instLB->ISACencLB_obj).frame_nb = 0;
  (instLB->ISACencLB_obj).bottleneck = 32000.0;
  (instLB->ISACencLB_obj).current_framesamples = 0;
  (instLB->ISACencLB_obj).s2nr = 0.0;
  (instLB->ISACencLB_obj).payloadLimitBytes30 = 200;
  (instLB->ISACencLB_obj).payloadLimitBytes60 = 400;
  (instLB->ISACencLB_obj).maxPayloadBytes = 400;
  (instLB->ISACencLB_obj).maxRateInBytes = 200;
  (instLB->ISACencLB_obj).enforceFrameSize = 0;
  (instLB->ISACencLB_obj).lastBWIdx = -1;
  return 200;
}

Assistant:

static int16_t EncoderInitLb(ISACLBStruct* instLB,
                             int16_t codingMode,
                             enum IsacSamplingRate sampRate) {
  int16_t statusInit = 0;
  int k;

  /* Init stream vector to zero */
  for (k = 0; k < STREAM_SIZE_MAX_60; k++) {
    instLB->ISACencLB_obj.bitstr_obj.stream[k] = 0;
  }

  if ((codingMode == 1) || (sampRate == kIsacSuperWideband)) {
    /* 30 ms frame-size if either in super-wideband or
     * instantaneous mode (I-mode). */
    instLB->ISACencLB_obj.new_framelength = 480;
  } else {
    instLB->ISACencLB_obj.new_framelength = INITIAL_FRAMESAMPLES;
  }

  WebRtcIsac_InitMasking(&instLB->ISACencLB_obj.maskfiltstr_obj);
  WebRtcIsac_InitPreFilterbank(&instLB->ISACencLB_obj.prefiltbankstr_obj);
  WebRtcIsac_InitPitchFilter(&instLB->ISACencLB_obj.pitchfiltstr_obj);
  WebRtcIsac_InitPitchAnalysis(
    &instLB->ISACencLB_obj.pitchanalysisstr_obj);

  instLB->ISACencLB_obj.buffer_index = 0;
  instLB->ISACencLB_obj.frame_nb = 0;
  /* Default for I-mode. */
  instLB->ISACencLB_obj.bottleneck = 32000;
  instLB->ISACencLB_obj.current_framesamples = 0;
  instLB->ISACencLB_obj.s2nr = 0;
  instLB->ISACencLB_obj.payloadLimitBytes30 = STREAM_SIZE_MAX_30;
  instLB->ISACencLB_obj.payloadLimitBytes60 = STREAM_SIZE_MAX_60;
  instLB->ISACencLB_obj.maxPayloadBytes = STREAM_SIZE_MAX_60;
  instLB->ISACencLB_obj.maxRateInBytes = STREAM_SIZE_MAX_30;
  instLB->ISACencLB_obj.enforceFrameSize = 0;
  /* Invalid value prevents getRedPayload to
     run before encoder is called. */
  instLB->ISACencLB_obj.lastBWIdx            = -1;
  return statusInit;
}